

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.h
# Opt level: O0

int fy_parse_peek_at(fy_parser *fyp,int pos)

{
  int iVar1;
  int pos_local;
  fy_parser *fyp_local;
  
  iVar1 = fy_parse_peek_at_internal(fyp,pos,(ssize_t *)0x0);
  return iVar1;
}

Assistant:

static inline int fy_parse_peek_at(struct fy_parser *fyp, int pos) {
    return fy_parse_peek_at_internal(fyp, pos, NULL);
}